

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp6.c
# Opt level: O3

void fp6_mul_sparse2(fp6_struct_st *rop,fp6_struct_st *op1,fp6_struct_st *op2,ATE_CTX *ctx)

{
  fp2_struct_st *pfVar1;
  fp2_struct_st *pfVar2;
  fp_struct_st *pfVar3;
  fp_struct_st *pfVar4;
  fp_struct_st *pfVar5;
  fp_struct_st *pfVar6;
  fp2_struct_st *pfVar7;
  fp2_struct_st *pfVar8;
  fp_struct_st *pfVar9;
  fp_struct_st *pfVar10;
  fp_struct_st *pfVar11;
  fp2_t tmp4;
  fp_t tmp3_1;
  fp2_t tmp5;
  fp2_t tmp1;
  fp2_t tmp2;
  fp_t tmp3_2;
  fp_t tmp2_3;
  fp_struct_st local_198;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  fp_struct_st local_138;
  undefined1 local_118 [32];
  fp2_struct_st local_f8;
  fp2_struct_st local_b8;
  undefined1 local_78 [32];
  fp_struct_st local_58;
  
  pfVar1 = op1->m_b;
  pfVar2 = op2->m_b;
  pfVar5 = ctx->p;
  pfVar6 = ctx->n0;
  bn_mul_mont(&local_f8,pfVar1,pfVar2,pfVar5,pfVar6,4);
  pfVar3 = op1->m_b[0].m_b;
  pfVar4 = op2->m_b[0].m_b;
  bn_mul_mont(&local_198,pfVar3,pfVar4,pfVar5,pfVar6,4);
  fp_add(&local_138,pfVar2,pfVar4,pfVar5);
  fp_add(&local_b8,pfVar1,pfVar3,pfVar5);
  pfVar9 = local_b8.m_b;
  fp_set(pfVar9,&local_198);
  bn_mul_mont(&local_b8,&local_b8,&local_138,pfVar5,pfVar6,4);
  fp_sub(&local_b8,&local_b8,&local_f8,pfVar5);
  fp_sub(&local_b8,&local_b8,pfVar9,pfVar5);
  fp_double(&local_f8,&local_f8,pfVar5);
  fp_sub(pfVar9,pfVar9,&local_f8,pfVar5);
  pfVar7 = op1->m_c;
  pfVar8 = op2->m_c;
  bn_mul_mont(&local_198,pfVar7,pfVar8,pfVar5,pfVar6,4);
  pfVar11 = op1->m_c[0].m_b;
  pfVar10 = op2->m_c[0].m_b;
  bn_mul_mont(&local_138,pfVar11,pfVar10,pfVar5,pfVar6,4);
  fp_add(local_158,pfVar8,pfVar10,pfVar5);
  fp_add(&local_f8,pfVar7,pfVar11,pfVar5);
  pfVar9 = local_f8.m_b;
  fp_set(pfVar9,&local_138);
  bn_mul_mont(&local_f8,&local_f8,local_158,pfVar5,pfVar6,4);
  fp_sub(&local_f8,&local_f8,&local_198,pfVar5);
  fp_sub(&local_f8,&local_f8,pfVar9,pfVar5);
  fp_double(&local_198,&local_198,pfVar5);
  fp_sub(pfVar9,pfVar9,&local_198,pfVar5);
  fp_add(&local_198,pfVar1,pfVar7,pfVar5);
  fp_add(local_178,pfVar3,pfVar11,pfVar5);
  fp_add(&local_138,pfVar2,pfVar8,pfVar5);
  fp_add(local_118,pfVar4,pfVar10,pfVar5);
  pfVar1 = rop->m_b;
  bn_mul_mont(local_158,&local_198,&local_138,pfVar5,pfVar6,4);
  bn_mul_mont(&local_58,local_178,local_118,pfVar5,pfVar6,4);
  fp_add(local_78,&local_138,local_118,pfVar5);
  fp_add(pfVar1,&local_198,local_178,pfVar5);
  pfVar3 = rop->m_b[0].m_b;
  fp_set(pfVar3,&local_58);
  bn_mul_mont(pfVar1,pfVar1,local_78,pfVar5,pfVar6,4);
  fp_sub(pfVar1,pfVar1,local_158,pfVar5);
  fp_sub(pfVar1,pfVar1,pfVar3,pfVar5);
  fp_double(local_158,local_158,pfVar5);
  fp_sub(pfVar3,pfVar3,local_158,pfVar5);
  fp_sub(pfVar1,pfVar1,&local_f8,pfVar5);
  fp_sub(pfVar3,pfVar3,local_f8.m_b,pfVar5);
  fp_sub(pfVar1,pfVar1,&local_b8,pfVar5);
  fp_sub(pfVar3,pfVar3,local_b8.m_b,pfVar5);
  fp2_set(rop->m_a,&local_b8);
  fp2_set(rop->m_c,&local_f8);
  return;
}

Assistant:

void fp6_mul_sparse2(fp6_t rop, const fp6_t op1, const fp6_t op2, const ATE_CTX *ctx)
{
    fp2_t tmp1, tmp2, tmp4, tmp5; // Needed for intermediary values

    fp2_mul(tmp2, op1->m_b, op2->m_b, ctx);
    fp2_mul(tmp1, op1->m_c, op2->m_c, ctx);

    fp2_add(tmp4, op1->m_b, op1->m_c, ctx->p);
    fp2_add(tmp5, op2->m_b, op2->m_c, ctx->p);
    fp2_mul(rop->m_b, tmp4, tmp5, ctx);
    fp2_sub(rop->m_b, rop->m_b, tmp1, ctx->p);
    fp2_sub(rop->m_b, rop->m_b, tmp2, ctx->p);

    fp2_set(rop->m_a, tmp2);
    fp2_set(rop->m_c, tmp1);
}